

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O2

void __thiscall
TestRegenerateCmakeTargetLinkLibraries_Interface::Run
          (TestRegenerateCmakeTargetLinkLibraries_Interface *this)

{
  __type _Var1;
  runtime_error *this_00;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_232;
  allocator_type local_231;
  string expectedOutput;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  privateDeps;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  publicDeps;
  ostringstream oss;
  string local_170 [344];
  
  std::__cxx11::string::string((string *)&oss,"ComponentA",(allocator *)&privateDeps);
  std::__cxx11::string::string(local_170,"ComponentB",(allocator *)&expectedOutput);
  __l._M_len = 2;
  __l._M_array = (iterator)&oss;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&publicDeps,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_210,&local_232);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&oss + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::__cxx11::string::string((string *)&oss,"ComponentZ",(allocator *)&expectedOutput);
  std::__cxx11::string::string(local_170,"ComponentY",(allocator *)&local_210);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&oss;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&privateDeps,__l_00,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_232,&local_231);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&oss + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::__cxx11::string::string
            ((string *)&expectedOutput,
             "target_link_libraries(${PROJECT_NAME}\n  INTERFACE\n    ComponentA\n    ComponentB\n    ComponentY\n    ComponentZ\n)\n\n"
             ,(allocator *)&oss);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  RegenerateCmakeTargetLinkLibraries((ostream *)&oss,&publicDeps,&privateDeps,true);
  std::__cxx11::stringbuf::str();
  _Var1 = std::operator==(&local_210,&expectedOutput);
  std::__cxx11::string::~string((string *)&local_210);
  if (_Var1) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    std::__cxx11::string::~string((string *)&expectedOutput);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&privateDeps._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&publicDeps._M_t);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed: oss.str() == expectedOutput");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TEST(RegenerateCmakeTargetLinkLibraries_Interface) {
  bool isHeaderOnly = true;
  const std::set<std::string> publicDeps{
    "ComponentA",
    "ComponentB"
  };
  const std::set<std::string> privateDeps{
    "ComponentZ",
    "ComponentY"
  };

  const std::string expectedOutput(
      "target_link_libraries(${PROJECT_NAME}\n"
      "  INTERFACE\n"
      "    ComponentA\n"
      "    ComponentB\n"
      "    ComponentY\n"
      "    ComponentZ\n"
      ")\n"
      "\n");

  std::ostringstream oss;
  RegenerateCmakeTargetLinkLibraries(oss, publicDeps, privateDeps, isHeaderOnly);

  ASSERT(oss.str() == expectedOutput);
}